

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void google::protobuf::internal::PackedFieldHelper<1>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  double dVar1;
  undefined8 in_RAX;
  double *pdVar2;
  int index;
  RepeatedField<double> *array;
  uint32_t local_28;
  undefined4 local_24;
  
  if (*field != 0) {
    _local_28 = CONCAT44((int)((ulong)in_RAX >> 0x20),md->tag);
    PrimitiveTypeHelper<13>::Serialize(&local_28,output);
    _local_28 = CONCAT44(*(undefined4 *)((long)field + 0x10),local_28);
    PrimitiveTypeHelper<13>::Serialize(&local_24,output);
    if (0 < *field) {
      index = 0;
      do {
        pdVar2 = RepeatedField<double>::Get((RepeatedField<double> *)field,index);
        dVar1 = *pdVar2;
        pdVar2 = (double *)output->cur_;
        if ((output->impl_).end_ <= pdVar2) {
          pdVar2 = (double *)
                   io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,(uint8_t *)pdVar2);
        }
        *pdVar2 = dVar1;
        output->cur_ = (uint8_t *)(pdVar2 + 1);
        index = index + 1;
      } while (index < *field);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}